

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DeferredFailIfUnicode
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  code *pcVar1;
  bool bVar2;
  CharCount pos;
  CharCount encodedPos;
  ScriptConfiguration *this_00;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  ParseError *this_01;
  TrackAllocData local_40;
  HRESULT local_14;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_10;
  HRESULT error_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  local_14 = error;
  pPStack_10 = this;
  this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x23e,"(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                       "this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->deferredIfUnicodeError == (ParseError *)0x0) {
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&ParseError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0x241);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_40);
    this_01 = (ParseError *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar4,0x3f67b0);
    bVar2 = this->inBody;
    pos = Pos(this);
    encodedPos = Chars<unsigned_char>::OSB(this->next,this->input);
    ParseError::ParseError(this_01,(bool)(bVar2 & 1),pos,encodedPos,local_14);
    this->deferredIfUnicodeError = this_01;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DeferredFailIfUnicode(HRESULT error)
    {
        Assert(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
        if (this->deferredIfUnicodeError == nullptr)
        {
            this->deferredIfUnicodeError = Anew(ctAllocator, ParseError, inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
        }
    }